

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::FormalArgumentSymbol::serializeTo(FormalArgumentSymbol *this,ASTSerializer *serializer)

{
  size_t __n;
  Expression *__n_00;
  
  VariableSymbol::serializeTo(&this->super_VariableSymbol,serializer);
  __n = strlen(*(char **)(toString(slang::ast::ArgumentDirection)::strings +
                         (long)(int)this->direction * 8));
  ASTSerializer::write(serializer,9,"direction",__n);
  __n_00 = getDefaultValue(this);
  if (__n_00 != (Expression *)0x0) {
    ASTSerializer::write(serializer,0xc,"defaultValue",(size_t)__n_00);
    return;
  }
  return;
}

Assistant:

void FormalArgumentSymbol::serializeTo(ASTSerializer& serializer) const {
    VariableSymbol::serializeTo(serializer);

    serializer.write("direction", toString(direction));
    if (auto defVal = getDefaultValue())
        serializer.write("defaultValue", *defVal);
}